

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O2

Value<char> * __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,Char_T *key,SizeT length)

{
  SizeT hash;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar1;
  SizeT *index;
  SizeT *local_48;
  String<char> local_40;
  
  if ((this->
      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      ).index_ ==
      (this->
      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
      ).capacity_) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    expand(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          );
  }
  hash = StringUtils::Hash<char>(key,length);
  pHVar1 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                  ,&local_48,key,length,hash);
  if (pHVar1 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    String<char>::String(&local_40,key,length);
    pHVar1 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::insert(&this->
                       super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                      ,local_48,&local_40,hash);
    Memory::Deallocate(local_40.storage_);
    (pHVar1->Value).type_ = Undefined;
    (pHVar1->Value).field_0.array_.storage_ = (Value<char> *)0x0;
    *(SizeT *)((long)&(pHVar1->Value).field_0 + 8) = 0;
    *(SizeT *)((long)&(pHVar1->Value).field_0 + 0xc) = 0;
  }
  return &pHVar1->Value;
}

Assistant:

Value_T &Get(const Char_T *key, const SizeT length) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key, length);
        SizeT      *index;
        HItem      *item = find(index, key, length, hash);

        if (item != nullptr) {
            return item->Value;
        }

        item = insert(index, Key_T{key, length}, hash);
        Memory::Initialize(&(item->Value));

        return item->Value;
    }